

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ZipDatabase::read_entry
          (ZipDatabase *this,ResourceTag tag,Hash hash,size_t *blob_size,void *blob,
          PayloadReadFlags flags)

{
  mz_uint file_index;
  ulong uVar1;
  bool bVar2;
  mz_bool mVar3;
  LogLevel LVar4;
  pointer ppVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false> local_50
  ;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false> local_48
  ;
  iterator itr;
  PayloadReadFlags flags_local;
  void *blob_local;
  size_t *blob_size_local;
  Hash hash_local;
  ZipDatabase *pZStack_18;
  ResourceTag tag_local;
  ZipDatabase *this_local;
  
  if ((flags & 1) == 0) {
    if (((this->alive & 1U) == 0) || (this->mode != ReadOnly)) {
      this_local._7_1_ = false;
    }
    else {
      itr.
      super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false>
      ._M_cur._4_4_ = flags;
      blob_size_local = (size_t *)hash;
      hash_local._4_4_ = tag;
      pZStack_18 = this;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
           ::find(this->seen_blobs + tag,(key_type *)&blob_size_local);
      local_50._M_cur =
           (__node_type *)
           std::
           end<std::unordered_map<unsigned_long,Fossilize::ZipDatabase::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>>>
                     (this->seen_blobs + hash_local._4_4_);
      bVar2 = std::__detail::operator==(&local_48,&local_50);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else if (blob_size == (size_t *)0x0) {
        this_local._7_1_ = false;
      }
      else if ((blob == (void *)0x0) ||
              (uVar1 = *blob_size,
              ppVar5 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                       ::operator->((_Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                                     *)&local_48), (ppVar5->second).size <= uVar1)) {
        ppVar5 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                               *)&local_48);
        *blob_size = (ppVar5->second).size;
        if (blob != (void *)0x0) {
          ppVar5 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                                 *)&local_48);
          file_index = (ppVar5->second).index;
          ppVar5 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_false,_false>
                                 *)&local_48);
          mVar3 = mz_zip_reader_extract_to_mem(&this->mz,file_index,blob,(ppVar5->second).size,0);
          if (mVar3 == 0) {
            LVar4 = get_thread_log_level();
            if (((int)LVar4 < 3) &&
               (bVar2 = Internal::log_thread_callback(LOG_ERROR,"Failed to extract blob.\n"), !bVar2
               )) {
              fprintf(_stderr,"Fossilize ERROR: Failed to extract blob.\n");
            }
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool read_entry(ResourceTag tag, Hash hash, size_t *blob_size, void *blob, PayloadReadFlags flags) override
	{
		if ((flags & PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (!alive || mode != DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr == end(seen_blobs[tag]))
			return false;

		if (!blob_size)
			return false;

		if (blob && *blob_size < itr->second.size)
			return false;
		*blob_size = itr->second.size;

		if (blob)
		{
			if (!mz_zip_reader_extract_to_mem(&mz, itr->second.index, blob, itr->second.size, 0))
			{
				LOGE_LEVEL("Failed to extract blob.\n");
				return false;
			}
		}

		return true;
	}